

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameIdenticalPayoff *this)

{
  ostream *poVar1;
  Index jtype;
  ulong uVar2;
  Index jaI;
  ulong uVar3;
  double extraout_XMM0_Qa;
  stringstream ss;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  BayesianGameBase::SoftPrint_abi_cxx11_(&sStack_1d8,(BayesianGameBase *)this);
  std::operator<<(local_1a8,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  poVar1 = std::operator<<(local_1a8,"Utility function:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0;
      uVar2 < (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes;
      uVar2 = (ulong)((int)uVar2 + 1)) {
    for (uVar3 = 0;
        uVar3 < (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
        uVar3 = (ulong)((int)uVar3 + 1)) {
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,uVar2,uVar3);
      poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrint() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrint();    
    ss << "Utility function:"<<endl;
    for(Index jtype=0; jtype < _m_nrJTypes; jtype++)
    {
        for(Index jaI=0; jaI < _m_nrJA; jaI++)
            ss << GetUtility(jtype,jaI) << " ";
        ss << endl;
    }
//    ss << _m_utilFunction->SoftPrint();
    return(ss.str());
}